

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightHandle __thiscall
pbrt::LightHandle::Create
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,CameraTransform *cameraTransform,MediumHandle *outsideMedium,FileLoc *loc,Allocator alloc
          )

{
  long lVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uintptr_t iptr_1;
  UniformInfiniteLight *p;
  PointLight *pPVar11;
  GoniometricLight *pGVar12;
  ProjectionLight *pPVar13;
  DistantLight *pDVar14;
  RGBColorSpace *pRVar15;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar16;
  ImageInfiniteLight *p_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Transform *loc_00;
  uint uVar17;
  iterator __begin10;
  pointer p_01;
  DenselySampledSpectrum *pDVar18;
  ulong uVar19;
  char *pcVar20;
  CameraTransform *loc_01;
  ulong uVar21;
  _Alloc_hider _Var22;
  long lVar23;
  Float FVar24;
  Float FVar25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [56];
  float fVar29;
  undefined1 auVar30 [16];
  Point3f PVar31;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Float local_4d8;
  float local_4d4;
  Allocator alloc_local;
  RGBColorSpace *colorSpace;
  Float local_4a4;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> L;
  string filename;
  undefined1 local_438 [16];
  ImageChannelDesc channelDesc;
  SpectrumHandle local_3a0;
  ColorEncodingHandle local_398;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_390;
  SpectrumHandle local_388;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_380;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_378;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_370;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_368;
  Image image;
  ImageAndMetadata imageAndMetadata;
  undefined4 extraout_var;
  undefined1 extraout_var_02 [60];
  
  (this->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = 0;
  alloc_local = alloc;
  loc_00 = renderFromLight;
  loc_01 = cameraTransform;
  iVar10 = std::__cxx11::string::compare((char *)name);
  if (iVar10 == 0) {
    local_368.bits =
         (outsideMedium->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits;
    pPVar11 = PointLight::Create(renderFromLight,(MediumHandle *)&local_368,parameters,
                                 parameters->colorSpace,(FileLoc *)loc_01,alloc);
    uVar19 = (ulong)pPVar11 | 0x1000000000000;
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar19;
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)name);
    if (iVar10 == 0) {
      local_370.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pPVar13 = (ProjectionLight *)
                SpotLight::Create(renderFromLight,(MediumHandle *)&local_370,parameters,
                                  parameters->colorSpace,(FileLoc *)loc_01,alloc);
      uVar19 = 0x5000000000000;
LAB_003bcf88:
      uVar19 = uVar19 | (ulong)pPVar13;
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)name);
      if (iVar10 != 0) {
        iVar10 = std::__cxx11::string::compare((char *)name);
        if (iVar10 == 0) {
          local_380.bits =
               (outsideMedium->
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               ).bits;
          pPVar13 = ProjectionLight::Create
                              (renderFromLight,(MediumHandle *)&local_380,parameters,loc,alloc);
          uVar19 = 0x3000000000000;
          goto LAB_003bcf88;
        }
        iVar10 = std::__cxx11::string::compare((char *)name);
        if (iVar10 == 0) {
          pDVar14 = DistantLight::Create
                              (renderFromLight,parameters,parameters->colorSpace,(FileLoc *)loc_00,
                               alloc);
          uVar19 = (ulong)pDVar14 | 0x2000000000000;
          goto LAB_003bcf8b;
        }
        iVar10 = std::__cxx11::string::compare((char *)name);
        if (iVar10 != 0) {
          pcVar20 = "%s: light type unknown.";
          goto LAB_003bd5e5;
        }
        pRVar15 = parameters->colorSpace;
        pIVar16 = &imageAndMetadata.image.channelNames;
        imageAndMetadata.image._0_8_ = pIVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"L","");
        ParameterDictionary::GetSpectrumArray
                  (&L,parameters,(string *)&imageAndMetadata,General,alloc_local);
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pIVar16) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        imageAndMetadata.image._0_8_ = pIVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"scale","");
        local_4d8 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pIVar16) {
          local_4d4 = local_4d8;
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
          local_4d8 = local_4d4;
        }
        imageAndMetadata.image._0_8_ = pIVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"portal","");
        ParameterDictionary::GetPoint3fArray(&portal,parameters,(string *)&imageAndMetadata);
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pIVar16) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        image._0_8_ = &image.channelNames;
        std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
        paVar2 = &channelDesc.offset.field_2;
        channelDesc.offset.alloc.memoryResource = (memory_resource *)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc,"");
        ParameterDictionary::GetOneString
                  ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&channelDesc);
        ResolveFilename(&filename,(string *)&imageAndMetadata);
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pIVar16) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
             *)channelDesc.offset.alloc.memoryResource != paVar2) {
          operator_delete(channelDesc.offset.alloc.memoryResource,
                          channelDesc.offset.field_2._0_8_ + 1);
        }
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)image._0_8_ != &image.channelNames) {
          operator_delete((void *)image._0_8_,
                          (ulong)((long)&(image.channelNames.alloc.memoryResource)->
                                         _vptr_memory_resource + 1));
        }
        imageAndMetadata.image._0_8_ = pIVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&imageAndMetadata,"illuminance","");
        FVar24 = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)imageAndMetadata.image._0_8_ != pIVar16) {
          operator_delete((void *)imageAndMetadata.image._0_8_,
                          (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)
                                         ->_vptr_memory_resource + 1));
        }
        if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (filename._M_string_length == 0) {
            pDVar18 = &pRVar15->illuminant;
            local_388.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                     )((ulong)pDVar18 | 0x2000000000000);
            FVar25 = SpectrumToPhotometric(&local_388);
            uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar24),1);
            bVar7 = (bool)((byte)uVar6 & 1);
            local_4d8 = (Float)((uint)bVar7 * (int)((FVar24 / 3.1415927) * (local_4d8 / FVar25)) +
                               (uint)!bVar7 * (int)(local_4d8 / FVar25));
            imageAndMetadata.image._0_8_ = pDVar18;
            iVar10 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                               (alloc_local.memoryResource,0xd8,8);
            p = (UniformInfiniteLight *)CONCAT44(extraout_var_00,iVar10);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,p,renderFromLight,(DenselySampledSpectrum **)&imageAndMetadata,
                       &local_4d8,&alloc_local);
            goto LAB_003bcea4;
          }
          local_398.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          Image::Read(&imageAndMetadata,&filename,alloc_local,&local_398);
          colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
          image._0_8_ = &image.channelNames;
          std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
          image.channelNames.field_2.fixed[0]._M_dataplus._M_p =
               (_Alloc_hider)((long)&image.channelNames.field_2 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&image.channelNames.field_2,"G","");
          _Var22._M_p = (pointer)((long)&image.channelNames.field_2 + 0x30);
          image.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var22._M_p;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&image.channelNames.field_2 + 0x20),"B","");
          requestedChannels.n = 3;
          requestedChannels.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
          Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
          lVar23 = -0x60;
          do {
            if ((long *)_Var22._M_p != *(long **)((long)_Var22._M_p + -0x10)) {
              operator_delete(*(long **)((long)_Var22._M_p + -0x10),*(long *)_Var22._M_p + 1);
            }
            _Var22._M_p = _Var22._M_p + -0x20;
            lVar23 = lVar23 + 0x20;
          } while (lVar23 != 0);
          if (channelDesc.offset.nStored == 0) {
            ErrorExit<std::__cxx11::string&>
                      (loc,
                       "%s: image provided to \"infinite\" light must have R, G, and B channels.",
                       &filename);
          }
          local_3a0.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                   )((ulong)&colorSpace->illuminant | 0x2000000000000);
          FVar25 = SpectrumToPhotometric(&local_3a0);
          iVar9 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
          uVar6 = imageAndMetadata.image._0_8_;
          iVar10 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
          local_4d8 = local_4d8 / FVar25;
          auVar26 = ZEXT864(0);
          if (0.0 < FVar24) {
            pRVar15 = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
            local_4d4 = 0.0;
            uVar17 = iVar9 / 2;
            if (1 < iVar9) {
              auVar3 = *(undefined1 (*) [16])((pRVar15->XYZFromRGB).m + 1);
              local_4a4 = (pRVar15->XYZFromRGB).m[1][2];
              uVar19 = 0;
              auVar5 = vmovshdup_avx(auVar3);
              local_4d4 = 0.0;
              do {
                fVar29 = (((float)(int)uVar19 + 0.5) /
                          (float)imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>.y
                         + -0.5) * 3.1415927;
                local_438._0_4_ = cosf(fVar29);
                local_438._4_4_ = extraout_XMM0_Db;
                local_438._8_4_ = extraout_XMM0_Dc;
                local_438._12_4_ = extraout_XMM0_Dd;
                auVar27._0_4_ = sinf(fVar29);
                auVar27._4_60_ = extraout_var_02;
                if (0xffffffff < (long)uVar6) {
                  auVar30._8_4_ = 0x7fffffff;
                  auVar30._0_8_ = 0x7fffffff7fffffff;
                  auVar30._12_4_ = 0x7fffffff;
                  uVar21 = 0;
                  auVar4 = vandps_avx(auVar30,local_438);
                  auVar30 = vandps_avx(auVar27._0_16_,auVar30);
                  do {
                    Image::GetChannels((ImageChannelValues *)&image,&imageAndMetadata.image,
                                       (Point2i)(uVar19 << 0x20 | uVar21),(WrapMode2D)0x200000002);
                    auVar26 = ZEXT464((uint)local_4d4);
                    pIVar16 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)image._8_8_;
                    if (image._8_8_ == 0) {
                      pIVar16 = &image.channelNames;
                    }
                    lVar23 = 0;
                    do {
                      fVar29 = auVar3._0_4_;
                      if (((int)lVar23 != 0) && (fVar29 = auVar5._0_4_, (int)lVar23 != 1)) {
                        fVar29 = local_4a4;
                      }
                      lVar1 = lVar23 * 4;
                      lVar23 = lVar23 + 1;
                      auVar8 = vfmadd213ss_fma(ZEXT416((uint)(auVar4._0_4_ *
                                                             fVar29 * *(float *)((long)&(pIVar16->
                                                                                        alloc).
                                                  memoryResource + lVar1))),auVar30,auVar26._0_16_);
                      auVar26 = ZEXT1664(auVar8);
                    } while (lVar23 != 3);
                    image.channelNames.field_2.fixed[0]._M_string_length = 0;
                    local_4d4 = auVar8._0_4_;
                    (**(code **)(*(long *)image._0_8_ + 0x18))
                              (image._0_8_,image._8_8_,
                               (long)image.channelNames.field_2.fixed[0]._M_dataplus._M_p << 2,4);
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != (iVar10 & 0x7fffffff));
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar17);
            }
            local_4d8 = (FVar24 / ((local_4d4 / ((float)iVar10 * (float)(int)uVar17)) * 9.869605)) *
                        local_4d8;
            auVar26 = ZEXT464((uint)local_4d8);
          }
          Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
          p_01 = portal.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            iVar10 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                               (alloc_local.memoryResource,0x2f8,8);
            p_00 = (ImageInfiniteLight *)CONCAT44(extraout_var_01,iVar10);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,p_00,renderFromLight,&image,&colorSpace,&local_4d8,&filename,
                       &alloc_local);
            uVar19 = 0x8000000000000;
          }
          else {
            do {
              auVar28 = auVar26._8_56_;
              PVar31 = CameraTransform::RenderFromWorld(cameraTransform,p_01);
              auVar26._0_8_ = PVar31.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar26._8_56_ = auVar28;
              uVar6 = vmovlps_avx(auVar26._0_16_);
              (p_01->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar6;
              (p_01->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar6 >> 0x20);
              (p_01->super_Tuple3<pbrt::Point3,_float>).z =
                   PVar31.super_Tuple3<pbrt::Point3,_float>.z;
              p_01 = p_01 + 1;
            } while (p_01 != portal.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            iVar10 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                               (alloc_local.memoryResource,0x280,8);
            p_00 = (ImageInfiniteLight *)CONCAT44(extraout_var,iVar10);
            pstd::pmr::polymorphic_allocator<std::byte>::
            construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&alloc_local,(PortalImageInfiniteLight *)p_00,renderFromLight,&image,
                       &colorSpace,&local_4d8,&filename,&portal,&alloc_local);
            uVar19 = 0x9000000000000;
          }
          uVar19 = (ulong)p_00 | uVar19;
          (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = uVar19;
          Image::~Image(&image);
          InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    (&channelDesc.offset);
          ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
        }
        else {
          if (filename._M_string_length != 0) {
            pcVar20 = "Can\'t specify both emission \"L\" and \"filename\" with InfiniteAreaLight";
LAB_003bd61e:
            ErrorExit(loc,pcVar20);
          }
          if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pcVar20 = "Portals are not supported for InfiniteAreaLights without \"filename\".";
            goto LAB_003bd61e;
          }
          local_390.bits =
               ((L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start)->
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               ).bits;
          FVar25 = SpectrumToPhotometric((SpectrumHandle *)&local_390);
          uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)FVar24),1);
          bVar7 = (bool)((byte)uVar6 & 1);
          local_4d8 = (Float)((uint)bVar7 * (int)((FVar24 / 3.1415927) * (local_4d8 / FVar25)) +
                             (uint)!bVar7 * (int)(local_4d8 / FVar25));
          p = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (&alloc_local,renderFromLight,
                         L.
                         super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_4d8,&alloc_local);
LAB_003bcea4:
          uVar19 = (ulong)p | 0x7000000000000;
          (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits = uVar19;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        if (portal.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(portal.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)portal.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)portal.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (L.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(L.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)L.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)L.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_003bcf9e;
      }
      local_378.bits =
           (outsideMedium->
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           ).bits;
      pGVar12 = GoniometricLight::Create
                          (renderFromLight,(MediumHandle *)&local_378,parameters,
                           parameters->colorSpace,loc,alloc);
      uVar19 = (ulong)pGVar12 | 0x4000000000000;
    }
LAB_003bcf8b:
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = uVar19;
  }
LAB_003bcf9e:
  if ((uVar19 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (LightHandle)
           (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            )this;
  }
  pcVar20 = "%s: unable to create light.";
LAB_003bd5e5:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar20,name);
}

Assistant:

LightHandle LightHandle::Create(const std::string &name,
                                const ParameterDictionary &parameters,
                                const Transform &renderFromLight,
                                const CameraTransform &cameraTransform,
                                MediumHandle outsideMedium, const FileLoc *loc,
                                Allocator alloc) {
    LightHandle light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<SpectrumHandle> L =
            parameters.GetSpectrumArray("L", SpectrumType::General, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale, alloc);
        } else if (!L.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with InfiniteAreaLight");

            if (!portal.empty())
                ErrorExit(loc, "Portals are not supported for InfiniteAreaLights "
                               "without \"filename\".");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale,
                                                           alloc);
        } else {
            ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc);
            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                int ye = image.Resolution().y / 2;
                int ys = 0;
                int xs = 0;
                int xe = image.Resolution().x;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = ys; y < ye; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    float theta = (v - 0.5f) * Pi;
                    float cosTheta = std::cos(theta);
                    float sinTheta = std::sin(theta);
                    for (int x = xs; x < xe; ++x) {
                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c) {
                            illuminance += values[c] * lum[c] * std::abs(cosTheta) *
                                           std::abs(sinTheta);
                        }
                    }
                }
                illuminance /= float(ye - ys) * float(xe - xs);
                illuminance *= Pi * Pi;

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}